

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lib.cc
# Opt level: O0

void __thiscall
kratos::asic::lib_single_port_sram_Test::~lib_single_port_sram_Test(lib_single_port_sram_Test *this)

{
  lib_single_port_sram_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(lib, single_port_sram) {  // NOLINT
    Context c;
    auto sram = std::make_shared<SinglePortSRAM>(&c, "sram_stub", 5, 16, true);
    fix_assignment_type(sram.get());
    verify_assignments(sram.get());
    verify_generator_connectivity(sram.get());
    hash_generators_parallel(sram.get());
    auto result = generate_verilog(sram.get());
    EXPECT_EQ(result.size(), 1);
    EXPECT_TRUE(result.find("sram_stub") != result.end());
    EXPECT_TRUE(is_valid_verilog(result));
}